

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player.cpp
# Opt level: O2

void __thiscall minibag::Player::doKeepAlive(Player *this)

{
  TimePublisher *this_00;
  bool bVar1;
  char cVar2;
  int iVar3;
  Time TVar4;
  TimeBase<miniros::WallTime,_miniros::WallDuration> TVar5;
  WallTime horizon;
  WallDuration shift;
  TimeBase<miniros::WallTime,_miniros::WallDuration> local_58;
  TimeBase<miniros::WallTime,_miniros::WallDuration> local_50;
  TimeTranslator *local_48;
  DurationBase<miniros::Duration> local_40;
  TimeBase<miniros::Time,_miniros::Duration> local_38;
  
  miniros::Duration::Duration((Duration *)&local_58,10.0);
  local_38 = (TimeBase<miniros::Time,_miniros::Duration>)
             miniros::TimeBase<miniros::Time,_miniros::Duration>::operator+
                       (&(this->time_publisher_).current_.
                         super_TimeBase<miniros::Time,_miniros::Duration>,(Duration *)&local_58);
  local_48 = &this->time_translator_;
  TVar4 = TimeTranslator::translate(local_48,(Time *)&local_38);
  miniros::TimeBase<miniros::WallTime,_miniros::WallDuration>::TimeBase
            (&local_58,TVar4.super_TimeBase<miniros::Time,_miniros::Duration>.sec,
             TVar4.super_TimeBase<miniros::Time,_miniros::Duration>.nsec);
  (this->time_publisher_).horizon_.super_TimeBase<miniros::Time,_miniros::Duration> = local_38;
  (this->time_publisher_).wc_horizon_.super_TimeBase<miniros::WallTime,_miniros::WallDuration> =
       local_58;
  if ((this->options_).at_once != false) {
    return;
  }
  this_00 = &this->time_publisher_;
  this->delayed_ = false;
  do {
    if ((this->paused_ == false) && (bVar1 = TimePublisher::horizonReached(this_00), bVar1)) {
      return;
    }
    cVar2 = miniros::NodeHandle::ok();
    if (cVar2 == '\0') {
      return;
    }
    while (cVar2 = miniros::NodeHandle::ok(), cVar2 != '\0') {
      iVar3 = readCharFromStdin(this);
      if (iVar3 == -1) {
        if (this->paused_ != true) break;
        printTime(this);
        miniros::WallDuration::WallDuration((WallDuration *)&local_50,0.1);
        TimePublisher::runStalledClock(this_00,(WallDuration *)&local_50);
        miniros::spinOnce();
      }
      else if (iVar3 == 0x20) {
        bVar1 = this->paused_;
        this->paused_ = (bool)(bVar1 ^ 1);
        if (bVar1 == false) {
          TVar5 = (TimeBase<miniros::WallTime,_miniros::WallDuration>)miniros::WallTime::now();
          (this->paused_time_).super_TimeBase<miniros::WallTime,_miniros::WallDuration> = TVar5;
        }
        else {
          local_40 = (DurationBase<miniros::Duration>)miniros::WallTime::now();
          miniros::TimeBase<miniros::WallTime,_miniros::WallDuration>::operator-
                    (&local_50,(WallTime *)&local_40);
          TVar5 = (TimeBase<miniros::WallTime,_miniros::WallDuration>)miniros::WallTime::now();
          (this->paused_time_).super_TimeBase<miniros::WallTime,_miniros::WallDuration> = TVar5;
          miniros::DurationBase<miniros::Duration>::DurationBase((int)&local_40,local_50.sec);
          TimeTranslator::shift(local_48,(Duration *)&local_40);
          miniros::TimeBase<miniros::WallTime,_miniros::WallDuration>::operator+=
                    (&local_58,(WallDuration *)&local_50);
          (this->time_publisher_).wc_horizon_.
          super_TimeBase<miniros::WallTime,_miniros::WallDuration> = local_58;
        }
      }
    }
    printTime(this);
    miniros::WallDuration::WallDuration((WallDuration *)&local_50,0.1);
    TimePublisher::runClock(this_00,(WallDuration *)&local_50);
    miniros::spinOnce();
  } while( true );
}

Assistant:

void Player::doKeepAlive() {
    //Keep pushing ourself out in 10-sec increments (avoids fancy math dealing with the end of time)
    miniros::Time const& time = time_publisher_.getTime() + miniros::Duration(10.0);

    miniros::Time translated = time_translator_.translate(time);
    miniros::WallTime horizon = miniros::WallTime(translated.sec, translated.nsec);

    time_publisher_.setHorizon(time);
    time_publisher_.setWCHorizon(horizon);

    if (options_.at_once) {
        return;
    }

    // If we're done and just staying alive, don't watch the rate control topic. We aren't publishing anyway.
    delayed_ = false;

    while ((paused_ || !time_publisher_.horizonReached()) && node_handle_.ok())
    {
        bool charsleftorpaused = true;
        while (charsleftorpaused && node_handle_.ok())
        {
            switch (readCharFromStdin()){
            case ' ':
                paused_ = !paused_;
                if (paused_) {
                    paused_time_ = miniros::WallTime::now();
                }
                else
                {
                    // Make sure time doesn't shift after leaving pause.
                    miniros::WallDuration shift = miniros::WallTime::now() - paused_time_;
                    paused_time_ = miniros::WallTime::now();
         
                    time_translator_.shift(miniros::Duration(shift.sec, shift.nsec));

                    horizon += shift;
                    time_publisher_.setWCHorizon(horizon);
                }
                break;
            case EOF:
                if (paused_)
                {
                    printTime();
                    time_publisher_.runStalledClock(miniros::WallDuration(.1));
                    miniros::spinOnce();
                }
                else
                    charsleftorpaused = false;
            }
        }

        printTime();
        time_publisher_.runClock(miniros::WallDuration(.1));
        miniros::spinOnce();
    }
}